

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

double __thiscall chrono::ChDirectSolverLS::SolveCurrent(ChDirectSolverLS *this)

{
  uint uVar1;
  rep_conflict rVar2;
  ChLog *pCVar3;
  ChStreamOutAscii *pCVar4;
  RealScalar dVal;
  double dVar5;
  Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_60;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  local_50;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_assembly).m_start.__d.__r = rVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows);
  ChTimer<double>::stop(&this->m_timer_solve_assembly);
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->m_timer_solve_solvercall).m_start.__d.__r = rVar2;
  uVar1 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xd])(this);
  ChTimer<double>::stop(&this->m_timer_solve_solvercall);
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    local_60 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                         ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                          &(this->m_mat).
                           super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_sol);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_50,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->m_rhs,
               (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_60);
    dVal = Eigen::
           MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>_>_>
           ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                   *)&local_50);
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<
                       (&pCVar3->super_ChStreamOutAscii," Solver SolveCurrent() [");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,this->m_solve_call);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"]  |residual| = ");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVal);
    ChStreamOutAscii::operator<<(pCVar4,"\n\n");
    pCVar3 = GetLog();
    pCVar4 = ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"  assembly rhs+sol:  ");
    dVar5 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_solve_assembly);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar5);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"s\n");
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,"  solve:             ");
    dVar5 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_solve_solvercall);
    pCVar4 = ChStreamOutAscii::operator<<(pCVar4,dVar5);
    ChStreamOutAscii::operator<<(pCVar4,"\n");
  }
  if ((char)uVar1 == '\0') {
    pCVar3 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar3->super_ChStreamOutAscii,"Solver SolveCurrent() failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return (double)(uVar1 & 0xff);
}

Assistant:

double ChDirectSolverLS::SolveCurrent() {
    m_timer_solve_assembly.start();
    m_sol.resize(m_rhs.size());
    m_timer_solve_assembly.stop();

    // Let the concrete solver compute the solution
    m_timer_solve_solvercall.start();
    bool result = SolveSystem();
    m_timer_solve_solvercall.stop();

    if (verbose) {
        double res_norm = (m_rhs - m_mat * m_sol).norm();
        GetLog() << " Solver SolveCurrent() [" << m_solve_call << "]  |residual| = " << res_norm << "\n\n";
        GetLog() << "  assembly rhs+sol:  " << m_timer_solve_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  solve:             " << m_timer_solve_solvercall.GetTimeSecondsIntermediate() << "\n";
    }

    if (!result) {
        // If the solution failed, let the concrete solver display an error message.
        GetLog() << "Solver SolveCurrent() failed\n";
        PrintErrorMessage();
    }

    return result;
}